

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void vector_gautbl_eval_logs3
               (vector_gautbl_t *gautbl,int32 offset,int32 count,float32 *x,int32 *score,
               logmath_t *logmath)

{
  int iVar1;
  float64 __x;
  double dVar2;
  double dVar3;
  float64 diff2;
  float64 diff1;
  float64 dval2;
  float64 dval1;
  float32 *v2;
  float32 *v1;
  float32 *m2;
  float32 *m1;
  int32 veclen;
  int32 end;
  float64 f;
  int32 r;
  int32 i;
  logmath_t *logmath_local;
  int32 *score_local;
  float32 *x_local;
  int32 count_local;
  int32 offset_local;
  vector_gautbl_t *gautbl_local;
  
  __x = logmath_get_base(logmath);
  dVar2 = log((double)__x);
  dVar2 = 1.0 / dVar2;
  iVar1 = gautbl->veclen;
  for (f._0_4_ = offset; f._0_4_ < offset + count + -1; f._0_4_ = f._0_4_ + 2) {
    dval2 = (float64)(double)(float)gautbl->lrd[f._0_4_];
    diff1 = (float64)(double)(float)gautbl->lrd[f._0_4_ + 1];
    for (f._4_4_ = 0; f._4_4_ < iVar1; f._4_4_ = f._4_4_ + 1) {
      dVar3 = (double)((float)x[f._4_4_] - (float)gautbl->mean[f._0_4_][f._4_4_]);
      dval2 = (float64)(-(dVar3 * dVar3) * (double)(float)gautbl->var[f._0_4_][f._4_4_] +
                       (double)dval2);
      dVar3 = (double)((float)x[f._4_4_] - (float)gautbl->mean[f._0_4_ + 1][f._4_4_]);
      diff1 = (float64)(-(dVar3 * dVar3) * (double)(float)gautbl->var[f._0_4_ + 1][f._4_4_] +
                       (double)diff1);
    }
    if ((double)dval2 < (double)gautbl->distfloor) {
      dval2 = gautbl->distfloor;
    }
    if ((double)diff1 < (double)gautbl->distfloor) {
      diff1 = gautbl->distfloor;
    }
    score[f._0_4_] = (int)(dVar2 * (double)dval2);
    score[f._0_4_ + 1] = (int)(dVar2 * (double)diff1);
  }
  if (f._0_4_ < offset + count) {
    dval2 = (float64)(double)(float)gautbl->lrd[f._0_4_];
    for (f._4_4_ = 0; f._4_4_ < iVar1; f._4_4_ = f._4_4_ + 1) {
      dVar3 = (double)((float)x[f._4_4_] - (float)gautbl->mean[f._0_4_][f._4_4_]);
      dval2 = (float64)(-(dVar3 * dVar3) * (double)(float)gautbl->var[f._0_4_][f._4_4_] +
                       (double)dval2);
    }
    if ((double)dval2 < (double)gautbl->distfloor) {
      dval2 = gautbl->distfloor;
    }
    score[f._0_4_] = (int)(dVar2 * (double)dval2);
  }
  return;
}

Assistant:

void
vector_gautbl_eval_logs3(vector_gautbl_t * gautbl,
                         int32 offset,
                         int32 count, float32 * x, int32 * score, logmath_t * logmath)
{
    int32 i, r;
    float64 f;
    int32 end, veclen;
    float32 *m1, *m2, *v1, *v2;
    float64 dval1, dval2, diff1, diff2;

    f = 1.0 / log(logmath_get_base(logmath));

    /* Interleave evaluation of two vectors at a time for speed on pipelined machines */
    end = offset + count;
    veclen = gautbl->veclen;

    for (r = offset; r < end - 1; r += 2) {
        m1 = gautbl->mean[r];
        m2 = gautbl->mean[r + 1];
        v1 = gautbl->var[r];
        v2 = gautbl->var[r + 1];
        dval1 = gautbl->lrd[r];
        dval2 = gautbl->lrd[r + 1];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
            diff2 = x[i] - m2[i];
            dval2 -= diff2 * diff2 * v2[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;
        if (dval2 < gautbl->distfloor)
            dval2 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
        score[r + 1] = (int32) (f * dval2);
    }

    if (r < end) {
        m1 = gautbl->mean[r];
        v1 = gautbl->var[r];
        dval1 = gautbl->lrd[r];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
    }
}